

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcShow.c
# Opt level: O3

void Wlc_NtkDumpDot(Wlc_Ntk_t *p,char *pFileName,Vec_Int_t *vBold)

{
  int *piVar1;
  Wlc_Obj_t WVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  FILE *__stream;
  long lVar8;
  char *pcVar9;
  Wlc_Obj_t *pWVar10;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar11;
  int iVar12;
  int iVar13;
  char *pcVar14;
  uint uVar15;
  size_t __size;
  Wlc_Obj_t *pWVar16;
  byte bVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  
  if (vBold == (Vec_Int_t *)0x0) {
    if (0x7d1 < p->iObj) goto LAB_0035691b;
    __stream = fopen(pFileName,"w");
    if (__stream == (FILE *)0x0) goto LAB_00356b8c;
    iVar4 = Wlc_NtkCreateLevels(p);
    uVar5 = iVar4 + 1;
  }
  else {
    if (2000 < vBold->nSize) {
LAB_0035691b:
      fprintf(_stdout,"Cannot visualize WLC with more than %d nodes.\n",2000);
      return;
    }
    __stream = fopen(pFileName,"w");
    if (__stream == (FILE *)0x0) {
LAB_00356b8c:
      fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",pFileName);
      return;
    }
    if (0 < vBold->nSize) {
      lVar8 = 0;
      do {
        iVar4 = vBold->pArray[lVar8];
        if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_00357d76;
        *(ushort *)(p->pObjs + iVar4) = *(ushort *)(p->pObjs + iVar4) | 0x80;
        lVar8 = lVar8 + 1;
      } while (lVar8 < vBold->nSize);
    }
    iVar4 = Wlc_NtkCreateLevels(p);
    uVar5 = Wlc_NtkRemapLevels(p,vBold,iVar4 + 1);
  }
  uVar18 = (ulong)uVar5;
  fprintf(__stream,"# %s\n","WLC structure generated by ABC");
  fputc(10,__stream);
  fwrite("digraph WLC {\n",0xe,1,__stream);
  fwrite("size = \"7.5,10\";\n",0x11,1,__stream);
  fwrite("center = true;\n",0xf,1,__stream);
  fwrite("edge [dir = back];\n",0x13,1,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  node [shape = plaintext];\n",0x1c,1,__stream);
  fwrite("  edge [style = invis];\n",0x18,1,__stream);
  fwrite("  LevelTitle1 [label=\"\"];\n",0x1a,1,__stream);
  fwrite("  LevelTitle2 [label=\"\"];\n",0x1a,1,__stream);
  uVar19 = uVar18;
  if ((int)uVar5 < 0) {
    fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,__stream);
  }
  else {
    do {
      iVar4 = (int)uVar19;
      fprintf(__stream,"  Level%d",uVar19);
      fwrite(" [label = ",10,1,__stream);
      fputc(0x22,__stream);
      fputc(0x22,__stream);
      fwrite("];\n",3,1,__stream);
      uVar19 = (ulong)(iVar4 - 1);
    } while (iVar4 != 0);
    fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,__stream);
    if (-1 < (int)uVar5) {
      fprintf(__stream,"  Level%d",uVar18);
      uVar15 = uVar5;
      while (uVar15 != 0) {
        uVar15 = uVar15 - 1;
        fwrite(" ->",3,1,__stream);
        fprintf(__stream,"  Level%d",(ulong)uVar15);
      }
      fputc(0x3b,__stream);
    }
  }
  fputc(10,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fwrite("  LevelTitle1;\n",0xf,1,__stream);
  fwrite("  title1 [shape=plaintext,\n",0x1b,1,__stream);
  fwrite("          fontsize=20,\n",0x17,1,__stream);
  fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
  fwrite("          label=\"",0x11,1,__stream);
  fputs("WLC structure generated by ABC",__stream);
  fwrite("\\n",2,1,__stream);
  pcVar14 = p->pName;
  if (p->pSpec == (char *)0x0) {
    pcVar9 = "unknown";
  }
  else {
    pcVar9 = Extra_FileNameWithoutPath(p->pSpec);
  }
  fprintf(__stream,"Benchmark \\\"%s\\\" from file \\\"%s\\\". ",pcVar14,pcVar9);
  fwrite("\"\n",2,1,__stream);
  fwrite("         ];\n",0xc,1,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fwrite("  LevelTitle2;\n",0xf,1,__stream);
  fwrite("  title2 [shape=plaintext,\n",0x1b,1,__stream);
  fwrite("          fontsize=18,\n",0x17,1,__stream);
  fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
  fwrite("          label=\"",0x11,1,__stream);
  fprintf(__stream,"The word-level network contains %d nodes and spans %d levels.",
          (ulong)(uint)(~(p->vCis).nSize + p->iObj));
  fwrite("\\n",2,1,__stream);
  fwrite("\"\n",2,1,__stream);
  fwrite("         ];\n",0xc,1,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fprintf(__stream,"  Level%d;\n",uVar18);
  iVar4 = (p->vCos).nSize;
  if (0 < iVar4) {
    lVar8 = 0;
    do {
      iVar12 = (p->vCos).pArray[lVar8];
      if (((long)iVar12 < 1) || (p->nObjsAlloc <= iVar12)) goto LAB_00357d76;
      pWVar16 = p->pObjs;
      if ((vBold == (Vec_Int_t *)0x0) ||
         ((undefined1  [24])((undefined1  [24])pWVar16[iVar12] & (undefined1  [24])0x80) !=
          (undefined1  [24])0x0)) {
        iVar4 = (p->vPos).nSize;
        if (lVar8 < iVar4) {
          uVar15 = (p->vPos).pArray[lVar8];
        }
        else {
          uVar19 = (ulong)(uint)((p->vPis).nSize - iVar4) + lVar8;
          iVar4 = (int)uVar19;
          if ((iVar4 < 0) || ((p->vCis).nSize <= iVar4)) goto LAB_00357d95;
          uVar15 = (p->vCis).pArray[uVar19 & 0xffffffff];
        }
        if (((int)uVar15 < 1) || ((uint)p->nObjsAlloc <= uVar15)) goto LAB_00357d76;
        pcVar9 = Wlc_ObjName(p,uVar15);
        pcVar14 = "T = %d\t\t";
        if ((*(uint *)(pWVar16 + uVar15) >> 9 & 1) == 0) {
          pcVar14 = "mem_data_in";
        }
        iVar12 = pWVar16[uVar15].End - pWVar16[uVar15].Beg;
        iVar4 = -iVar12;
        if (0 < iVar12) {
          iVar4 = iVar12;
        }
        fprintf(__stream,"  NodePo%d [label = \"%s%s %d\"",(ulong)uVar15,pcVar9,pcVar14 + 8,
                (ulong)(iVar4 + 1));
        pcVar14 = "box";
        if (lVar8 < (p->vPos).nSize) {
          pcVar14 = "invtriangle";
        }
        fprintf(__stream,", shape = %s",pcVar14);
        fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
        fwrite("];\n",3,1,__stream);
        iVar4 = (p->vCos).nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar4);
  }
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  while (uVar15 = uVar5 - 1, 1 < (int)uVar5) {
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    fprintf(__stream,"  Level%d;\n",(ulong)uVar15);
    iVar4 = p->iObj;
    if (1 < iVar4) {
      uVar19 = 1;
      do {
        if ((long)p->nObjsAlloc <= (long)uVar19) goto LAB_00357d76;
        if ((long)(p->vLevels).nSize <= (long)uVar19) goto LAB_00357d95;
        if ((p->vLevels).pArray[uVar19] == uVar15) {
          pWVar16 = p->pObjs + uVar19;
          if ((vBold == (Vec_Int_t *)0x0) || ((*(ushort *)pWVar16 & 0x80) != 0)) {
            uVar5 = *(ushort *)pWVar16 & 0x3f;
            if (uVar5 - 7 < 2) {
              iVar12 = pWVar16->End - pWVar16->Beg;
              iVar4 = -iVar12;
              if (0 < iVar12) {
                iVar4 = iVar12;
              }
              fprintf(__stream,"  Node%d [label = \"%d: %d\"",uVar19 & 0xffffffff,
                      uVar19 & 0xffffffff,(ulong)(iVar4 + 1));
            }
            else if (uVar5 == 6) {
              iVar12 = pWVar16->End - pWVar16->Beg;
              iVar4 = -iVar12;
              if (0 < iVar12) {
                iVar4 = iVar12;
              }
              fprintf(__stream,"  Node%d [label = \"%d:%d\'h",uVar19 & 0xffffffff,
                      uVar19 & 0xffffffff,(ulong)(iVar4 + 1));
              uVar7 = pWVar16->End - pWVar16->Beg;
              uVar5 = -uVar7;
              if (0 < (int)uVar7) {
                uVar5 = uVar7;
              }
              if (uVar5 < 0x40) {
                if ((*(ushort *)pWVar16 & 0x3f) != 6) goto LAB_00357db4;
                piVar1 = (pWVar16->field_10).pFanins[0];
                uVar7 = (uVar5 + 4 >> 2) + 1;
                uVar5 = uVar5 + 4 & 0xfffffffc;
                do {
                  uVar5 = uVar5 - 4;
                  uVar6 = (uint)(*(ulong *)(piVar1 + (ulong)(uVar7 - 2 >> 4) * 2) >>
                                ((byte)uVar5 & 0x3c)) & 0xf;
                  iVar4 = uVar6 + 0x30;
                  if (9 < uVar6) {
                    iVar4 = uVar6 + 0x57;
                  }
                  fputc(iVar4,__stream);
                  uVar7 = uVar7 - 1;
                } while (1 < uVar7);
              }
              else {
                if ((*(ushort *)pWVar16 & 0x3f) != 6) goto LAB_00357db4;
                piVar1 = (pWVar16->field_10).pFanins[0];
                uVar5 = 0x11;
                bVar17 = 0x3c;
                do {
                  uVar7 = (uint)(*(ulong *)(piVar1 + (ulong)(uVar5 - 2 >> 4) * 2) >> (bVar17 & 0x3c)
                                ) & 0xf;
                  iVar4 = uVar7 + 0x30;
                  if (9 < uVar7) {
                    iVar4 = uVar7 + 0x57;
                  }
                  fputc(iVar4,__stream);
                  uVar5 = uVar5 - 1;
                  bVar17 = bVar17 - 4;
                } while (1 < uVar5);
                fwrite("...",3,1,__stream);
              }
              fputc(0x22,__stream);
            }
            else {
              pcVar14 = Wlc_ObjTypeName(pWVar16);
              if ((ushort)((short)uVar5 - 0x1aU) < 0xb) {
                fprintf(__stream,"  Node%d [label = \"%d:%s\"",uVar19 & 0xffffffff,
                        uVar19 & 0xffffffff,pcVar14);
              }
              else {
                iVar12 = pWVar16->End - pWVar16->Beg;
                iVar4 = -iVar12;
                if (0 < iVar12) {
                  iVar4 = iVar12;
                }
                fprintf(__stream,"  Node%d [label = \"%d:%s %d\"",uVar19 & 0xffffffff,
                        uVar19 & 0xffffffff,pcVar14,(ulong)(iVar4 + 1));
              }
            }
            uVar7 = (uint)*(ushort *)pWVar16;
            uVar5 = uVar7 & 0x3f;
            if (uVar5 == 0x2d) {
              __size = 0x16;
              pcVar14 = ", shape = doublecircle";
            }
            else if ((ushort)((short)uVar5 - 0x1fU) < 6) {
              __size = 0x11;
              pcVar14 = ", shape = diamond";
            }
            else if (uVar5 < 0x1a) {
              if ((0xc00020U >> (uVar7 & 0x1f) & 1) == 0) {
                if ((0x3000080U >> (uVar7 & 0x1f) & 1) == 0) {
                  if (uVar5 != 8) goto LAB_003573d4;
                  __size = 0x13;
                  pcVar14 = ", shape = trapezium";
                }
                else {
                  __size = 0x12;
                  pcVar14 = ", shape = triangle";
                }
              }
              else {
                __size = 0xd;
                pcVar14 = ", shape = box";
              }
            }
            else {
LAB_003573d4:
              __size = 0x11;
              pcVar14 = ", shape = ellipse";
            }
            fwrite(pcVar14,__size,1,__stream);
            if (vBold == (Vec_Int_t *)0x0) {
              uVar3 = *(ushort *)pWVar16 & 0x3f;
              if (uVar3 == 0xf || (ushort)(uVar3 - 0x2b) < 10) goto LAB_003573fa;
            }
            else if ((char)*(ushort *)pWVar16 < '\0') {
LAB_003573fa:
              fwrite(", style = filled",0x10,1,__stream);
            }
            fwrite("];\n",3,1,__stream);
            iVar4 = p->iObj;
          }
        }
        uVar19 = uVar19 + 1;
      } while ((long)uVar19 < (long)iVar4);
    }
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    uVar5 = uVar15;
  }
  uVar19 = 1;
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fprintf(__stream,"  Level%d;\n",0);
  iVar4 = p->iObj;
  if (1 < iVar4) {
    do {
      if ((long)p->nObjsAlloc <= (long)uVar19) goto LAB_00357d76;
      pWVar16 = p->pObjs + uVar19;
      WVar2 = *pWVar16;
      if ((((undefined1  [24])((undefined1  [24])WVar2 & (undefined1  [24])0x3d) ==
            (undefined1  [24])0x1) || ((int)pWVar16->nFanins < 1)) &&
         ((vBold == (Vec_Int_t *)0x0 ||
          ((undefined1  [24])((undefined1  [24])WVar2 & (undefined1  [24])0x80) !=
           (undefined1  [24])0x0)))) {
        if ((undefined1  [24])((undefined1  [24])WVar2 & (undefined1  [24])0x3f) ==
            (undefined1  [24])0x6) {
          iVar12 = pWVar16->End - pWVar16->Beg;
          iVar4 = -iVar12;
          if (0 < iVar12) {
            iVar4 = iVar12;
          }
          fprintf(__stream,"  Node%d [label = \"%d:%d\'h",uVar19 & 0xffffffff,uVar19 & 0xffffffff,
                  (ulong)(iVar4 + 1));
          uVar15 = pWVar16->End - pWVar16->Beg;
          uVar5 = -uVar15;
          if (0 < (int)uVar15) {
            uVar5 = uVar15;
          }
          if (uVar5 < 0x40) {
            if ((*(ushort *)pWVar16 & 0x3f) != 6) goto LAB_00357db4;
            piVar1 = (pWVar16->field_10).pFanins[0];
            uVar15 = (uVar5 + 4 >> 2) + 1;
            uVar5 = uVar5 + 4 & 0xfffffffc;
            do {
              uVar5 = uVar5 - 4;
              uVar7 = (uint)(*(ulong *)(piVar1 + (ulong)(uVar15 - 2 >> 4) * 2) >>
                            ((byte)uVar5 & 0x3c)) & 0xf;
              iVar4 = uVar7 + 0x30;
              if (9 < uVar7) {
                iVar4 = uVar7 + 0x57;
              }
              fputc(iVar4,__stream);
              uVar15 = uVar15 - 1;
            } while (1 < uVar15);
          }
          else {
            if ((*(ushort *)pWVar16 & 0x3f) != 6) {
LAB_00357db4:
              __assert_fail("p->Type == WLC_OBJ_CONST",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                            ,0x145,"int *Wlc_ObjConstValue(Wlc_Obj_t *)");
            }
            piVar1 = (pWVar16->field_10).pFanins[0];
            uVar5 = 0x11;
            bVar17 = 0x3c;
            do {
              uVar15 = (uint)(*(ulong *)(piVar1 + (ulong)(uVar5 - 2 >> 4) * 2) >> (bVar17 & 0x3c)) &
                       0xf;
              iVar4 = uVar15 + 0x30;
              if (9 < uVar15) {
                iVar4 = uVar15 + 0x57;
              }
              fputc(iVar4,__stream);
              uVar5 = uVar5 - 1;
              bVar17 = bVar17 - 4;
            } while (1 < uVar5);
            fwrite("...",3,1,__stream);
          }
          fputc(0x22,__stream);
        }
        else {
          pcVar14 = Wlc_ObjName(p,(int)uVar19);
          iVar12 = pWVar16->End - pWVar16->Beg;
          iVar4 = -iVar12;
          if (0 < iVar12) {
            iVar4 = iVar12;
          }
          fprintf(__stream,"  Node%d [label = \"%d:%s %d\"",uVar19 & 0xffffffff,uVar19 & 0xffffffff,
                  pcVar14,(ulong)(iVar4 + 1));
          pcVar14 = "triangle";
          if ((p->vFfs2).nSize < 1) {
            if ((undefined1  [24])((undefined1  [24])*pWVar16 & (undefined1  [24])0x3d) !=
                (undefined1  [24])0x1) {
              __assert_fail("Wlc_ObjIsCi(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                            ,0x12d,"int Wlc_ObjCiId(Wlc_Obj_t *)");
            }
            pcVar14 = "box";
            if ((pWVar16->field_10).Fanins[1] < (p->vPis).nSize) {
              pcVar14 = "triangle";
            }
          }
          fprintf(__stream,", shape = %s",pcVar14);
          fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
        }
        fwrite("];\n",3,1,__stream);
        iVar4 = p->iObj;
      }
      uVar19 = uVar19 + 1;
    } while ((long)uVar19 < (long)iVar4);
  }
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("title1 -> title2 [style = invis];\n",0x22,1,__stream);
  iVar4 = (p->vCos).nSize;
  if (0 < iVar4) {
    lVar8 = 0;
    do {
      iVar12 = (p->vCos).pArray[lVar8];
      if (((long)iVar12 < 1) || (p->nObjsAlloc <= iVar12)) goto LAB_00357d76;
      if ((vBold == (Vec_Int_t *)0x0) ||
         ((undefined1  [24])((undefined1  [24])p->pObjs[iVar12] & (undefined1  [24])0x80) !=
          (undefined1  [24])0x0)) {
        iVar4 = (p->vPos).nSize;
        if (lVar8 < iVar4) {
          uVar5 = (p->vPos).pArray[lVar8];
        }
        else {
          uVar19 = (ulong)(uint)((p->vPis).nSize - iVar4) + lVar8;
          iVar4 = (int)uVar19;
          if ((iVar4 < 0) || ((p->vCis).nSize <= iVar4)) goto LAB_00357d95;
          uVar5 = (p->vCis).pArray[uVar19 & 0xffffffff];
        }
        if (((int)uVar5 < 1) || ((uint)p->nObjsAlloc <= uVar5)) goto LAB_00357d76;
        fprintf(__stream,"title2 -> NodePo%d [style = invis];\n");
        iVar4 = (p->vCos).nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar4);
    if (0 < iVar4) {
      iVar12 = -1;
      lVar8 = 0;
      do {
        iVar13 = (p->vCos).pArray[lVar8];
        if ((iVar13 < 1) || (p->nObjsAlloc <= iVar13)) goto LAB_00357d76;
        pWVar16 = p->pObjs;
        iVar13 = (p->vPos).nSize;
        if (lVar8 < iVar13) {
          uVar5 = (p->vPos).pArray[lVar8];
        }
        else {
          uVar19 = (ulong)(uint)((p->vPis).nSize - iVar13) + lVar8;
          iVar13 = (int)uVar19;
          if ((iVar13 < 0) || ((p->vCis).nSize <= iVar13)) goto LAB_00357d95;
          uVar5 = (p->vCis).pArray[uVar19 & 0xffffffff];
        }
        if (((int)uVar5 < 1) || ((uint)p->nObjsAlloc <= uVar5)) goto LAB_00357d76;
        pWVar10 = pWVar16 + uVar5;
        if ((vBold == (Vec_Int_t *)0x0) ||
           ((undefined1  [24])((undefined1  [24])*pWVar10 & (undefined1  [24])0x80) !=
            (undefined1  [24])0x0)) {
          if (-1 < iVar12) {
            fprintf(__stream,"NodePo%d -> NodePo%d [style = invis];\n");
            pWVar16 = p->pObjs;
            iVar4 = (p->vCos).nSize;
          }
          iVar12 = (int)((ulong)((long)pWVar10 - (long)pWVar16) >> 3) * -0x55555555;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar4);
    }
  }
  iVar12 = (p->vCis).nSize;
  if (0 < iVar12) {
    iVar4 = -1;
    lVar8 = 0;
    do {
      iVar13 = (p->vCis).pArray[lVar8];
      if (((long)iVar13 < 1) || (p->nObjsAlloc <= iVar13)) goto LAB_00357d76;
      pWVar10 = p->pObjs;
      pWVar16 = pWVar10 + iVar13;
      if ((vBold == (Vec_Int_t *)0x0) ||
         ((undefined1  [24])((undefined1  [24])*pWVar16 & (undefined1  [24])0x80) !=
          (undefined1  [24])0x0)) {
        if (-1 < iVar4) {
          fprintf(__stream,"Node%d -> Node%d [style = invis];\n");
          pWVar10 = p->pObjs;
          iVar12 = (p->vCis).nSize;
        }
        iVar4 = (int)((ulong)((long)pWVar16 - (long)pWVar10) >> 3) * -0x55555555;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar12);
    iVar4 = (p->vCos).nSize;
  }
  if (0 < iVar4) {
    lVar8 = 0;
    do {
      iVar12 = (p->vCos).pArray[lVar8];
      if (((long)iVar12 < 1) || (p->nObjsAlloc <= iVar12)) goto LAB_00357d76;
      pWVar16 = p->pObjs + iVar12;
      if ((vBold == (Vec_Int_t *)0x0) ||
         ((undefined1  [24])((undefined1  [24])*pWVar16 & (undefined1  [24])0x80) !=
          (undefined1  [24])0x0)) {
        iVar4 = (p->vPos).nSize;
        if (lVar8 < iVar4) {
          uVar5 = (p->vPos).pArray[lVar8];
        }
        else {
          uVar19 = (ulong)(uint)((p->vPis).nSize - iVar4) + lVar8;
          iVar4 = (int)uVar19;
          if ((iVar4 < 0) || ((p->vCis).nSize <= iVar4)) {
LAB_00357d95:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar5 = (p->vCis).pArray[uVar19 & 0xffffffff];
        }
        if (((int)uVar5 < 1) || ((uint)p->nObjsAlloc <= uVar5)) goto LAB_00357d76;
        fprintf(__stream,"NodePo%d");
        fwrite(" -> ",4,1,__stream);
        fprintf(__stream,"Node%d",
                (ulong)(uint)((int)((ulong)((long)pWVar16 - (long)p->pObjs) >> 3) * -0x55555555));
        fwrite(" [",2,1,__stream);
        pcVar14 = "dotted";
        if ((undefined1  [24])((undefined1  [24])*pWVar16 & (undefined1  [24])0x40) ==
            (undefined1  [24])0x0) {
          pcVar14 = "solid";
        }
        fprintf(__stream,"style = %s",pcVar14);
        fputc(0x5d,__stream);
        fwrite(";\n",2,1,__stream);
        iVar4 = (p->vCos).nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar4);
  }
  iVar4 = p->iObj;
  if (1 < iVar4) {
    lVar8 = 1;
    do {
      if (p->nObjsAlloc <= lVar8) {
LAB_00357d76:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      WVar2 = p->pObjs[lVar8];
      if (((undefined1  [24])((undefined1  [24])WVar2 & (undefined1  [24])0x3d) !=
           (undefined1  [24])0x1) &&
         ((vBold == (Vec_Int_t *)0x0 ||
          ((undefined1  [24])((undefined1  [24])WVar2 & (undefined1  [24])0x80) !=
           (undefined1  [24])0x0)))) {
        pWVar16 = p->pObjs + lVar8;
        uVar5 = pWVar16->nFanins;
        if (0 < (int)uVar5) {
          lVar20 = 0;
          do {
            if ((2 < uVar5) ||
               (paVar11 = &pWVar16->field_10, (*(uint *)pWVar16 & 0x3f | 0x10) == 0x16)) {
              paVar11 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar16->field_10).pFanins[0];
            }
            uVar15 = paVar11->Fanins[lVar20];
            uVar19 = (ulong)uVar15;
            if (uVar19 != 0) {
              fprintf(__stream,"Node%d");
              fwrite(" -> ",4,1,__stream);
              fprintf(__stream,"Node%d",uVar19);
              fwrite(" [",2,1,__stream);
              if (((int)uVar15 < 1) || (p->nObjsAlloc <= (int)uVar15)) goto LAB_00357d76;
              pcVar14 = "dotted";
              if ((undefined1  [24])((undefined1  [24])p->pObjs[uVar19] & (undefined1  [24])0x40) ==
                  (undefined1  [24])0x0) {
                pcVar14 = "solid";
              }
              fprintf(__stream,"style = %s",pcVar14);
              if ((lVar20 == 0) &&
                 ((undefined1  [24])((undefined1  [24])*pWVar16 & (undefined1  [24])0x3f) ==
                  (undefined1  [24])0x8)) {
                fprintf(__stream,", style = %s","bold");
              }
              fputc(0x5d,__stream);
              fwrite(";\n",2,1,__stream);
              uVar5 = pWVar16->nFanins;
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 < (int)uVar5);
          iVar4 = p->iObj;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar4);
  }
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fclose(__stream);
  if (vBold == (Vec_Int_t *)0x0) {
    return;
  }
  Wlc_NtkCleanMarks(p);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Writes the graph structure of WLC for DOT.]

  Description [Useful for graph visualization using tools such as GraphViz: 
  http://www.graphviz.org/]
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_NtkDumpDot( Wlc_Ntk_t * p, char * pFileName, Vec_Int_t * vBold )
{
    FILE * pFile;
    Wlc_Obj_t * pNode;
    int LevelMax, Prev, Level, i;

    if ( vBold ? (Vec_IntSize(vBold) > 2000) : (Wlc_NtkObjNum(p) > 2000) )
    {
        fprintf( stdout, "Cannot visualize WLC with more than %d nodes.\n", 2000 );
        return;
    }
    if ( (pFile = fopen( pFileName, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", pFileName );
        return;
    }

    // mark the nodes
    if ( vBold )
        Wlc_NtkForEachObjVec( vBold, p, pNode, i )
            pNode->Mark = 1;

    // compute levels
    LevelMax = 1 + Wlc_NtkCreateLevels( p );
    if ( vBold )
        LevelMax = Wlc_NtkRemapLevels( p, vBold, LevelMax );

//    Wlc_NtkForEachObj( p, pNode, i )
//        printf( "Obj=%d Lev=%d\n", i, Wlc_ObjLevel(p, pNode) );
//    printf( "\n" );

    // write the DOT header
    fprintf( pFile, "# %s\n",  "WLC structure generated by ABC" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "digraph WLC {\n" );
    fprintf( pFile, "size = \"7.5,10\";\n" );
//  fprintf( pFile, "ranksep = 0.5;\n" );
//  fprintf( pFile, "nodesep = 0.5;\n" );
    fprintf( pFile, "center = true;\n" );
//  fprintf( pFile, "orientation = landscape;\n" );
//  fprintf( pFile, "edge [fontsize = 10];\n" );
//  fprintf( pFile, "edge [dir = none];\n" );
    fprintf( pFile, "edge [dir = back];\n" );
    fprintf( pFile, "\n" );

    // labels on the left of the picture
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  node [shape = plaintext];\n" );
    fprintf( pFile, "  edge [style = invis];\n" );
    fprintf( pFile, "  LevelTitle1 [label=\"\"];\n" );
    fprintf( pFile, "  LevelTitle2 [label=\"\"];\n" );
    // generate node names with labels
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d", Level );
        fprintf( pFile, " [label = " );
        // label name
        fprintf( pFile, "\"" );
        fprintf( pFile, "\"" );
        fprintf( pFile, "];\n" );
    }

    // genetate the sequence of visible/invisible nodes to mark levels
    fprintf( pFile, "  LevelTitle1 ->  LevelTitle2 ->" );
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d",  Level );
        // the connector
        if ( Level != 0 )
            fprintf( pFile, " ->" );
        else
            fprintf( pFile, ";" );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate title box on top
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle1;\n" );
    fprintf( pFile, "  title1 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=20,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "%s", "WLC structure generated by ABC" );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "Benchmark \\\"%s\\\" from file \\\"%s\\\". ", p->pName, p->pSpec ? Extra_FileNameWithoutPath(p->pSpec) : "unknown" );
//    fprintf( pFile, "Time was %s. ",  Extra_TimeStamp() );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate statistics box
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle2;\n" );
    fprintf( pFile, "  title2 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=18,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "The word-level network contains %d nodes and spans %d levels.", Wlc_NtkObjNum(p)-Wlc_NtkCiNum(p), LevelMax-1 );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate the COs
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  LevelMax );
    // generate the CO nodes
    Wlc_NtkForEachCo( p, pNode, i )
    {
        if ( vBold && !pNode->Mark )
            continue;
        pNode = Wlc_ObjCo2PoFo(p, i);
        fprintf( pFile, "  NodePo%d [label = \"%s%s %d\"", Wlc_ObjId(p, pNode), Wlc_ObjName(p, Wlc_ObjId(p, pNode)), Wlc_ObjIsPo(pNode)? "":"_in",  Wlc_ObjRange(pNode) ); 
        fprintf( pFile, ", shape = %s", i < Wlc_NtkPoNum(p) ? "invtriangle" : "box" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate nodes of each rank
    for ( Level = LevelMax - 1; Level > 0; Level-- )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  Level );
        Wlc_NtkForEachObj( p, pNode, i )
        {
            if ( (int)Wlc_ObjLevel(p, pNode) != Level )
                continue;
            if ( vBold && !pNode->Mark )
                continue;

            if ( pNode->Type == WLC_OBJ_CONST )
            {
                //char * pName = Wlc_ObjName(p, i);
                fprintf( pFile, "  Node%d [label = \"%d:%d\'h", i, i, Wlc_ObjRange(pNode) ); 
                if ( Wlc_ObjRange(pNode) > 64 )
                {
                    Abc_TtPrintHexArrayRev( pFile, (word *)Wlc_ObjConstValue(pNode), 16 );
                    fprintf( pFile, "..." );
                }
                else
                    Abc_TtPrintHexArrayRev( pFile, (word *)Wlc_ObjConstValue(pNode), (Wlc_ObjRange(pNode) + 3) / 4 );
                fprintf( pFile, "\"" ); 
            }
            else if ( pNode->Type == WLC_OBJ_BUF || pNode->Type == WLC_OBJ_MUX )
                fprintf( pFile, "  Node%d [label = \"%d: %d\"", i, i, Wlc_ObjRange(pNode) ); 
            else if ( pNode->Type >= WLC_OBJ_LOGIC_NOT && pNode->Type <= WLC_OBJ_COMP_MOREEQU )
                fprintf( pFile, "  Node%d [label = \"%d:%s\"", i, i, Wlc_ObjTypeName(pNode) ); 
            else
                fprintf( pFile, "  Node%d [label = \"%d:%s %d\"", i, i, Wlc_ObjTypeName(pNode), Wlc_ObjRange(pNode) ); 

            if ( pNode->Type == WLC_OBJ_ARI_MULTI )
                fprintf( pFile, ", shape = doublecircle" );
            else if ( pNode->Type >= WLC_OBJ_COMP_EQU && pNode->Type <= WLC_OBJ_COMP_MOREEQU )
                fprintf( pFile, ", shape = diamond" );
            else if ( pNode->Type == WLC_OBJ_BIT_SELECT || pNode->Type == WLC_OBJ_BIT_CONCAT || pNode->Type == WLC_OBJ_FF )
                fprintf( pFile, ", shape = box" );
            else if ( pNode->Type == WLC_OBJ_BUF || pNode->Type == WLC_OBJ_BIT_ZEROPAD || pNode->Type == WLC_OBJ_BIT_SIGNEXT )
                fprintf( pFile, ", shape = triangle" );
            else if ( pNode->Type == WLC_OBJ_MUX )
                fprintf( pFile, ", shape = trapezium" );
            else
                fprintf( pFile, ", shape = ellipse" );

            if ( vBold ? pNode->Mark : ((pNode->Type >= WLC_OBJ_ARI_ADD && pNode->Type <= WLC_OBJ_ARI_SQUARE) || pNode->Type == WLC_OBJ_BIT_NOT) )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate the CI nodes
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  0 );
    // generate the CI nodes
    Wlc_NtkForEachObj( p, pNode, i )
    {
        if ( !Wlc_ObjIsCi(pNode) && Wlc_ObjFaninNum(pNode) > 0 )
            continue;
        if ( vBold && !pNode->Mark )
            continue;
        if ( pNode->Type == WLC_OBJ_CONST )
        {
            //char * pName = Wlc_ObjName(p, i);
            fprintf( pFile, "  Node%d [label = \"%d:%d\'h", i, i, Wlc_ObjRange(pNode) ); 
            if ( Wlc_ObjRange(pNode) > 64 )
            {
                Abc_TtPrintHexArrayRev( pFile, (word *)Wlc_ObjConstValue(pNode), 16 );
                fprintf( pFile, "..." );
            }
            else
                Abc_TtPrintHexArrayRev( pFile, (word *)Wlc_ObjConstValue(pNode), (Wlc_ObjRange(pNode) + 3) / 4 );
            fprintf( pFile, "\"" ); 
        }
        else
        {
            fprintf( pFile, "  Node%d [label = \"%d:%s %d\"", Wlc_ObjId(p, pNode), Wlc_ObjId(p, pNode), Wlc_ObjName(p, Wlc_ObjId(p, pNode)), Wlc_ObjRange(pNode) ); 
            fprintf( pFile, ", shape = %s", (Vec_IntSize(&p->vFfs2) > 0 || Wlc_ObjCiId(pNode) < Wlc_NtkPiNum(p)) ? "triangle" : "box" );
            fprintf( pFile, ", color = coral, fillcolor = coral" );
        }
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate invisible edges from the square down
    fprintf( pFile, "title1 -> title2 [style = invis];\n" );
    Wlc_NtkForEachCo( p, pNode, i )
    {
        if ( vBold && !pNode->Mark )
            continue;
        pNode = Wlc_ObjCo2PoFo( p, i );
        fprintf( pFile, "title2 -> NodePo%d [style = invis];\n", Wlc_ObjId(p, pNode) );
    }
    // generate invisible edges among the COs
    Prev = -1;
    Wlc_NtkForEachCo( p, pNode, i )
    {
        pNode = Wlc_ObjCo2PoFo( p, i );
        if ( vBold && !pNode->Mark )
            continue;
        if ( Prev >= 0 )
            fprintf( pFile, "NodePo%d -> NodePo%d [style = invis];\n", Prev, Wlc_ObjId(p, pNode) );
        Prev = Wlc_ObjId(p, pNode);
    }
    // generate invisible edges among the CIs
    Prev = -1;
    Wlc_NtkForEachCi( p, pNode, i )
    {
        if ( vBold && !pNode->Mark )
            continue;
        if ( Prev >= 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, Wlc_ObjId(p, pNode) );
        Prev = Wlc_ObjId(p, pNode);
    }

    // generate edges
    Wlc_NtkForEachCo( p, pNode, i )
    {
        if ( vBold && !pNode->Mark )
            continue;
        fprintf( pFile, "NodePo%d",  Wlc_ObjId(p, Wlc_ObjCo2PoFo(p, i)) );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Wlc_ObjId(p, pNode) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", pNode->Signed? "dotted" : "solid" );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
    }
    Wlc_NtkForEachObj( p, pNode, i )
    {
        int k, iFanin;
        if ( Wlc_ObjIsCi(pNode) )
            continue;
        if ( vBold && !pNode->Mark )
            continue;
        // generate the edge from this node to the next
        Wlc_ObjForEachFanin( pNode, iFanin, k ) if ( iFanin )
        {
            fprintf( pFile, "Node%d",  i );
            fprintf( pFile, " -> " );
            fprintf( pFile, "Node%d",  iFanin );
            fprintf( pFile, " [" );
            fprintf( pFile, "style = %s", Wlc_NtkObj(p, iFanin)->Signed? "dotted" : "solid" );
            if ( pNode->Type == WLC_OBJ_MUX && k == 0 )
                fprintf( pFile, ", style = %s", "bold" );
            fprintf( pFile, "]" );
            fprintf( pFile, ";\n" );
        }
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );

    // unmark nodes
    if ( vBold )
        Wlc_NtkCleanMarks( p );
}